

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O2

RGBColor __thiscall pm::Matte::shade(Matte *this,ShadeRecord *sr)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  char cVar5;
  long in_RDX;
  uint uVar6;
  _func_int **pp_Var7;
  _func_int **extraout_XMM0_Qa;
  _func_int **extraout_XMM0_Qa_00;
  float fVar8;
  float fVar9;
  RGBColor RVar10;
  Vector3 wi;
  RGBColor local_a0;
  _func_int **local_94;
  float local_8c;
  float local_88;
  float fStack_84;
  ulong uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float local_60;
  _func_int **local_58;
  float local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar1 = *(undefined8 *)&(sr->normal).z;
  local_88 = (float)uVar1;
  fStack_84 = (float)((ulong)uVar1 >> 0x20);
  local_78._4_4_ = (sr->ray).o.y * local_88;
  local_78._0_4_ = local_88 * fStack_84;
  local_78._8_4_ = fStack_84 * 0.0;
  local_78._12_4_ = 0;
  local_88 = local_88 * (sr->ray).o.z;
  uStack_80 = 0;
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_a0);
  pp_Var7 = (_func_int **)
            CONCAT44(local_a0.g * (float)local_78._4_4_,local_a0.r * (float)local_78._0_4_);
  fVar8 = local_88 * local_a0.b;
  (this->super_Material)._vptr_Material = pp_Var7;
  (this->super_Material).type_ = (Type)fVar8;
  lVar2 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80);
  lVar3 = *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  uVar6 = 0;
  do {
    if ((ulong)(lVar2 - lVar3 >> 3) <= (ulong)uVar6) {
      RVar10.b = fVar8;
      RVar10._0_8_ = pp_Var7;
      return RVar10;
    }
    plVar4 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + (ulong)uVar6 * 8);
    (**(code **)(*plVar4 + 0x10))(&local_58,plVar4);
    fVar9 = *(float *)(in_RDX + 0x30) * local_50 +
            *(float *)(in_RDX + 0x28) * SUB84(local_58,0) +
            (float)((ulong)local_58 >> 0x20) * *(float *)(in_RDX + 0x2c);
    pp_Var7 = local_58;
    fVar8 = local_50;
    if (0.0 < fVar9) {
      local_78 = ZEXT416((uint)fVar9);
      if (*(char *)((long)plVar4 + 0xc) == '\x01') {
        local_a0._0_8_ = *(undefined8 *)(in_RDX + 0x10);
        local_a0.b = *(float *)(in_RDX + 0x18);
        local_94 = local_58;
        local_8c = local_50;
        cVar5 = (**(code **)(*plVar4 + 0x20))(plVar4,&local_a0);
        pp_Var7 = extraout_XMM0_Qa;
        if (cVar5 != '\0') goto LAB_00110775;
      }
      fVar8 = SUB84(sr->world,0);
      fVar9 = (float)((ulong)sr->world >> 0x20);
      local_88 = fVar8 * fVar9 * 0.31830987;
      fStack_84 = *(float *)&sr->tracer * fVar8 * 0.31830987;
      uStack_80 = (ulong)(uint)(fVar9 * 0.0 * 0.0);
      local_48 = CONCAT44(fVar9,fVar8 * *(float *)((long)&sr->tracer + 4) * 0.31830987);
      uStack_40 = 0;
      (**(code **)(*plVar4 + 0x18))(local_68,plVar4);
      fVar8 = (float)local_78._0_4_ * local_68._0_4_ * local_88;
      local_a0.b = (float)local_48 * local_60 * (float)local_78._0_4_;
      local_a0.g = (float)local_78._0_4_ * local_68._4_4_ * fStack_84;
      local_a0.r = fVar8;
      RGBColor::operator+=((RGBColor *)this,&local_a0);
      pp_Var7 = extraout_XMM0_Qa_00;
    }
LAB_00110775:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

RGBColor Matte::shade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		const Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += diffuseBrdf_.f(sr, wo, wi) * light.L(sr) * nDotWi;
		}
	}

	return L;
}